

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_DeriveKey
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hBaseKey,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey)

{
  bool bVar1;
  ulong uVar2;
  CK_STATE CVar3;
  long lVar4;
  long lVar5;
  long *in_RDX;
  long in_RDI;
  CK_ATTRIBUTE_PTR in_R8;
  CK_ULONG in_R9;
  long in_stack_00000008;
  CK_KEY_TYPE baseKeyType;
  bool isImplicit;
  CK_CERTIFICATE_TYPE dummy;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  CK_RV rv;
  CK_BBOOL isKeyPrivate;
  CK_BBOOL isKeyOnToken;
  OSObject *key;
  Token *token;
  Session *session;
  CK_ULONG in_stack_00000a60;
  CK_ATTRIBUTE_PTR in_stack_00000a68;
  CK_OBJECT_HANDLE in_stack_00000a70;
  CK_MECHANISM_PTR in_stack_00000a78;
  CK_SESSION_HANDLE in_stack_00000a80;
  SoftHSM *in_stack_00000a88;
  CK_OBJECT_HANDLE in_stack_00000a90;
  CK_MECHANISM_PTR in_stack_00000a98;
  CK_OBJECT_HANDLE_PTR in_stack_00000aa0;
  SoftHSM *in_stack_00000aa8;
  CK_BBOOL in_stack_00000ab0;
  CK_BBOOL in_stack_00000ab8;
  CK_OBJECT_HANDLE_PTR in_stack_00000ac0;
  CK_KEY_TYPE in_stack_00000ac8;
  CK_BBOOL in_stack_00000ad0;
  CK_BBOOL in_stack_00000ad8;
  CK_ULONG in_stack_000012c0;
  CK_ATTRIBUTE_PTR in_stack_000012c8;
  CK_OBJECT_HANDLE in_stack_000012d0;
  CK_MECHANISM_PTR in_stack_000012d8;
  CK_SESSION_HANDLE in_stack_000012e0;
  SoftHSM *in_stack_000012e8;
  CK_OBJECT_HANDLE_PTR in_stack_00001300;
  CK_KEY_TYPE in_stack_00001308;
  CK_BBOOL in_stack_00001310;
  CK_BBOOL in_stack_00001318;
  Session *in_stack_ffffffffffffff38;
  Session *this_00;
  bool local_a1;
  CK_OBJECT_HANDLE in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  CK_BBOOL isPrivateObject;
  CK_BBOOL in_stack_ffffffffffffff8f;
  CK_BBOOL isTokenObject;
  CK_KEY_TYPE local_70;
  CK_OBJECT_CLASS local_68;
  CK_RV local_60;
  byte local_52;
  byte local_51;
  long *local_50;
  Token *local_48;
  Session *local_40;
  CK_ULONG local_38;
  CK_ATTRIBUTE_PTR local_30;
  long *local_20;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == (long *)0x0) {
    local_8 = 7;
  }
  else if (in_R8 == (CK_ATTRIBUTE_PTR)0x0) {
    local_8 = 7;
  }
  else if (in_stack_00000008 == 0) {
    local_8 = 7;
  }
  else {
    local_38 = in_R9;
    local_30 = in_R8;
    local_20 = in_RDX;
    local_40 = (Session *)
               HandleManager::getSession
                         ((HandleManager *)
                          CONCAT17(in_stack_ffffffffffffff8f,
                                   CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)),
                          in_stack_ffffffffffffff80);
    if (local_40 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      lVar4 = *local_20;
      if ((((lVar4 == 0x21) || (lVar4 == 0x360)) || (lVar4 - 0x362U < 2)) ||
         ((lVar4 == 0x1050 || (lVar4 - 0x1100U < 6)))) {
        local_48 = Session::getToken(local_40);
        if (local_48 == (Token *)0x0) {
          local_8 = 5;
        }
        else {
          local_50 = (long *)HandleManager::getObject
                                       ((HandleManager *)
                                        CONCAT17(in_stack_ffffffffffffff8f,
                                                 CONCAT16(in_stack_ffffffffffffff8e,
                                                          in_stack_ffffffffffffff88)),
                                        in_stack_ffffffffffffff80);
          if ((local_50 == (long *)0x0) ||
             (uVar2 = (**(code **)(*local_50 + 0x50))(), (uVar2 & 1) == 0)) {
            local_8 = 0x82;
          }
          else {
            local_51 = (**(code **)(*local_50 + 0x20))(local_50,1,0);
            local_51 = local_51 & 1;
            local_52 = (**(code **)(*local_50 + 0x20))(local_50,2,1);
            local_52 = local_52 & 1;
            CVar3 = Session::getState(in_stack_ffffffffffffff38);
            local_60 = haveRead(CVar3,local_51,local_52);
            if (local_60 == 0) {
              uVar2 = (**(code **)(*local_50 + 0x20))(local_50,0x10c,0);
              if ((uVar2 & 1) == 0) {
                local_8 = 0x68;
              }
              else {
                bVar1 = isMechanismPermitted
                                  ((SoftHSM *)pTemplate,(OSObject *)ulCount,
                                   (CK_MECHANISM_PTR)session);
                if (bVar1) {
                  isTokenObject = '\0';
                  isPrivateObject = '\x01';
                  local_a1 = true;
                  if ((*local_20 != 0x363) && (local_a1 = true, *local_20 != 0x362)) {
                    local_a1 = *local_20 == 0x360;
                  }
                  if (local_a1 != false) {
                    local_68 = 4;
                    local_70 = 0x10;
                  }
                  this_00 = (Session *)&stack0xffffffffffffff8e;
                  local_60 = extractObjectInformation
                                       (local_30,local_38,&stack0xffffffffffffff98,
                                        &stack0xffffffffffffff90,
                                        (CK_CERTIFICATE_TYPE *)&stack0xffffffffffffff80,
                                        &stack0xffffffffffffff8f,(CK_BBOOL *)this_00,local_a1);
                  if (local_60 == 0) {
                    if (local_68 == 4) {
                      if ((((local_70 == 0x10) || (local_70 == 0x13)) || (local_70 == 0x14)) ||
                         ((local_70 == 0x15 || (local_70 == 0x1f)))) {
                        CVar3 = Session::getState(this_00);
                        local_60 = haveWrite(CVar3,isTokenObject,isPrivateObject);
                        if (local_60 == 0) {
                          if (*local_20 == 0x21) {
                            lVar4 = (**(code **)(*local_50 + 0x28))(local_50,0,0x80000000);
                            if (lVar4 == 3) {
                              lVar4 = (**(code **)(*local_50 + 0x28))(local_50,0x100,0x80000000);
                              if (lVar4 == 2) {
                                local_8 = deriveDH(in_stack_00000a88,in_stack_00000a80,
                                                   in_stack_00000a78,in_stack_00000a70,
                                                   in_stack_00000a68,in_stack_00000a60,
                                                   in_stack_00000aa0,(CK_KEY_TYPE)in_stack_00000aa8,
                                                   in_stack_00000ab0,in_stack_00000ab8);
                              }
                              else {
                                local_8 = 99;
                              }
                            }
                            else {
                              local_8 = 99;
                            }
                          }
                          else if (*local_20 == 0x1050) {
                            lVar4 = (**(code **)(*local_50 + 0x28))(local_50,0,0x80000000);
                            if (lVar4 == 3) {
                              lVar4 = (**(code **)(*local_50 + 0x28))(local_50,0x100,0x80000000);
                              if (lVar4 == 3) {
                                local_8 = deriveECDH(in_stack_00000aa8,
                                                     (CK_SESSION_HANDLE)in_stack_00000aa0,
                                                     in_stack_00000a98,in_stack_00000a90,
                                                     (CK_ATTRIBUTE_PTR)in_stack_00000a88,
                                                     in_stack_00000a80,in_stack_00000ac0,
                                                     in_stack_00000ac8,in_stack_00000ad0,
                                                     in_stack_00000ad8);
                              }
                              else {
                                lVar4 = (**(code **)(*local_50 + 0x28))(local_50,0x100,0x80000000);
                                if (lVar4 == 0x40) {
                                  local_8 = deriveEDDSA(in_stack_00000aa8,
                                                        (CK_SESSION_HANDLE)in_stack_00000aa0,
                                                        in_stack_00000a98,in_stack_00000a90,
                                                        (CK_ATTRIBUTE_PTR)in_stack_00000a88,
                                                        in_stack_00000a80,in_stack_00000ac0,
                                                        in_stack_00000ac8,in_stack_00000ad0,
                                                        in_stack_00000ad8);
                                }
                                else {
                                  local_8 = 99;
                                }
                              }
                            }
                            else {
                              local_8 = 99;
                            }
                          }
                          else if (((((*local_20 == 0x1100) || (*local_20 == 0x1101)) ||
                                    ((*local_20 == 0x1102 ||
                                     (((*local_20 == 0x1103 || (*local_20 == 0x1104)) ||
                                      (*local_20 == 0x1105)))))) ||
                                   ((*local_20 == 0x363 || (*local_20 == 0x362)))) ||
                                  (*local_20 == 0x360)) {
                            lVar4 = (**(code **)(*local_50 + 0x28))(local_50,0x100,0x80000000);
                            lVar5 = (**(code **)(*local_50 + 0x28))(local_50,0,0x80000000);
                            if (lVar5 == 4) {
                              if ((*local_20 == 0x1100) && (lVar4 != 0x13)) {
                                local_8 = 99;
                              }
                              else if ((*local_20 == 0x1101) && (lVar4 != 0x13)) {
                                local_8 = 99;
                              }
                              else if (((*local_20 == 0x1102) && (lVar4 != 0x14)) && (lVar4 != 0x15)
                                      ) {
                                local_8 = 99;
                              }
                              else if (((*local_20 == 0x1103) && (lVar4 != 0x14)) && (lVar4 != 0x15)
                                      ) {
                                local_8 = 99;
                              }
                              else if ((*local_20 == 0x1104) && (lVar4 != 0x1f)) {
                                local_8 = 99;
                              }
                              else if ((*local_20 == 0x1105) && (lVar4 != 0x1f)) {
                                local_8 = 99;
                              }
                              else {
                                local_8 = deriveSymmetric(in_stack_000012e8,in_stack_000012e0,
                                                          in_stack_000012d8,in_stack_000012d0,
                                                          in_stack_000012c8,in_stack_000012c0,
                                                          in_stack_00001300,in_stack_00001308,
                                                          in_stack_00001310,in_stack_00001318);
                              }
                            }
                            else {
                              local_8 = 99;
                            }
                          }
                          else {
                            local_8 = 0x70;
                          }
                        }
                        else {
                          if (local_60 == 0x101) {
                            softHSMLog(6,"C_DeriveKey",
                                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                       ,0x1cb0,"User is not authorized");
                          }
                          if (local_60 == 0xb5) {
                            softHSMLog(6,"C_DeriveKey",
                                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                                       ,0x1cb2,"Session is read-only");
                          }
                          local_8 = local_60;
                        }
                      }
                      else {
                        local_8 = 0xd1;
                      }
                    }
                    else {
                      local_8 = 0x13;
                    }
                  }
                  else {
                    softHSMLog(3,"C_DeriveKey",
                               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                               ,0x1c9d,"Mandatory attribute not present in template");
                    local_8 = local_60;
                  }
                }
                else {
                  local_8 = 0x70;
                }
              }
            }
            else {
              if (local_60 == 0x101) {
                softHSMLog(6,"C_DeriveKey",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x1c7f,"User is not authorized");
              }
              local_8 = local_60;
            }
          }
        }
      }
      else {
        softHSMLog(3,"C_DeriveKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x1c6b,"Invalid mechanism");
        local_8 = 0x70;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_DeriveKey
(
	CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hBaseKey,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey
)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phKey == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check the mechanism, only accept DH and ECDH derive
	switch (pMechanism->mechanism)
	{
		case CKM_DH_PKCS_DERIVE:
#if defined(WITH_ECC) || defined(WITH_EDDSA)
		case CKM_ECDH1_DERIVE:
#endif
#ifndef WITH_FIPS
		case CKM_DES_ECB_ENCRYPT_DATA:
		case CKM_DES_CBC_ENCRYPT_DATA:
#endif
		case CKM_DES3_ECB_ENCRYPT_DATA:
		case CKM_DES3_CBC_ENCRYPT_DATA:
		case CKM_AES_ECB_ENCRYPT_DATA:
		case CKM_AES_CBC_ENCRYPT_DATA:
		case CKM_CONCATENATE_DATA_AND_BASE:
		case CKM_CONCATENATE_BASE_AND_DATA:
		case CKM_CONCATENATE_BASE_AND_KEY:
			break;

		default:
			ERROR_MSG("Invalid mechanism");
			return CKR_MECHANISM_INVALID;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hBaseKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isKeyOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	CK_RV rv = haveRead(session->getState(), isKeyOnToken, isKeyPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for derive
	if (!key->getBooleanValue(CKA_DERIVE, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass;
	CK_KEY_TYPE keyType;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	CK_CERTIFICATE_TYPE dummy;
    bool isImplicit = pMechanism->mechanism == CKM_CONCATENATE_DATA_AND_BASE ||
			pMechanism->mechanism == CKM_CONCATENATE_BASE_AND_DATA ||
			pMechanism->mechanism == CKM_CONCATENATE_BASE_AND_KEY;
    if (isImplicit) {
        // PKCS#11 2.40 section 2.31.5: if no key type is provided then the key produced by this mechanism will
        // be a generic secret key
        objClass = CKO_SECRET_KEY;
        keyType = CKK_GENERIC_SECRET;
    }
    rv = extractObjectInformation(pTemplate, ulCount, objClass, keyType, dummy, isOnToken, isPrivate, isImplicit);
    if (rv != CKR_OK) {
        ERROR_MSG("Mandatory attribute not present in template");
        return rv;
    }

	// Report errors and/or unexpected usage.
	if (objClass != CKO_SECRET_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	if (keyType != CKK_GENERIC_SECRET &&
	    keyType != CKK_DES &&
	    keyType != CKK_DES2 &&
	    keyType != CKK_DES3 &&
	    keyType != CKK_AES)
		return CKR_TEMPLATE_INCONSISTENT;

	// Check authorization
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Derive DH secret
	if (pMechanism->mechanism == CKM_DH_PKCS_DERIVE)
	{
		// Check key class and type
		if (key->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_PRIVATE_KEY)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_DH)
			return CKR_KEY_TYPE_INCONSISTENT;

		return this->deriveDH(hSession, pMechanism, hBaseKey, pTemplate, ulCount, phKey, keyType, isOnToken, isPrivate);
	}

#if defined(WITH_ECC) || defined(WITH_EDDSA)
	// Derive ECDH secret
	if (pMechanism->mechanism == CKM_ECDH1_DERIVE)
	{
		// Check key class and type
		if (key->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_PRIVATE_KEY)
			return CKR_KEY_TYPE_INCONSISTENT;
#ifdef WITH_ECC
		else if (key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) == CKK_EC)
			return this->deriveECDH(hSession, pMechanism, hBaseKey, pTemplate, ulCount, phKey, keyType, isOnToken, isPrivate);
#endif
#ifdef WITH_EDDSA
		else if (key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) == CKK_EC_EDWARDS)
			return this->deriveEDDSA(hSession, pMechanism, hBaseKey, pTemplate, ulCount, phKey, keyType, isOnToken, isPrivate);
#endif
		else
			return CKR_KEY_TYPE_INCONSISTENT;
	}
#endif

	// Derive symmetric secret
	if (pMechanism->mechanism == CKM_DES_ECB_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_DES_CBC_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_DES3_ECB_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_DES3_CBC_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_AES_ECB_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_AES_CBC_ENCRYPT_DATA ||
	    pMechanism->mechanism == CKM_CONCATENATE_DATA_AND_BASE ||
	    pMechanism->mechanism == CKM_CONCATENATE_BASE_AND_DATA ||
	    pMechanism->mechanism == CKM_CONCATENATE_BASE_AND_KEY)
	{
		// Check key class and type
		CK_KEY_TYPE baseKeyType = key->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED);
		if (key->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_SECRET_KEY)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_DES_ECB_ENCRYPT_DATA &&
		    baseKeyType != CKK_DES)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_DES_CBC_ENCRYPT_DATA &&
		    baseKeyType != CKK_DES)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_DES3_ECB_ENCRYPT_DATA &&
		    baseKeyType != CKK_DES2 && baseKeyType != CKK_DES3)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_DES3_CBC_ENCRYPT_DATA &&
		    baseKeyType != CKK_DES2 && baseKeyType != CKK_DES3)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_AES_ECB_ENCRYPT_DATA &&
		    baseKeyType != CKK_AES)
			return CKR_KEY_TYPE_INCONSISTENT;
		if (pMechanism->mechanism == CKM_AES_CBC_ENCRYPT_DATA &&
		    baseKeyType != CKK_AES)
			return CKR_KEY_TYPE_INCONSISTENT;

		return this->deriveSymmetric(hSession, pMechanism, hBaseKey, pTemplate, ulCount, phKey, keyType, isOnToken, isPrivate);
	}

	return CKR_MECHANISM_INVALID;
}